

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

void __thiscall OutputStream::writeInt8(OutputStream *this,int8_t v)

{
  anon_union_1_2_9473010d conv;
  
  (**this->_vptr_OutputStream)(this,(ulong)(byte)v);
  return;
}

Assistant:

void OutputStream::writeInt8(int8_t v) {
  union {
    uint8_t u;
    int8_t i;
  } conv;

  conv.i = v;

  writeByte(conv.u);
}